

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,endpoint *ep,span<const_char> buf)

{
  session_logger *psVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  iterator iVar5;
  ulong uVar6;
  endpoint *ep_00;
  endpoint *ep_01;
  uint32_t transaction;
  shared_ptr<libtorrent::aux::udp_tracker_connection> p;
  type_conflict local_54;
  string local_50;
  char *local_30;
  ulong local_28;
  
  uVar6 = buf.m_len;
  if ((long)uVar6 < 8) {
    iVar3 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar3 == '\0') {
      return false;
    }
    psVar1 = this->m_ses;
    print_endpoint_abi_cxx11_(&local_50,(aux *)ep,ep_00);
    (*psVar1->_vptr_session_logger[1])
              (psVar1,"incoming packet from %s, not a UDP tracker message (%d Bytes)",
               local_50._M_dataplus._M_p,uVar6 & 0xffffffff);
  }
  else {
    local_30 = buf.m_ptr;
    local_28 = uVar6;
    tVar4 = read_impl<unsigned_int,char_const>();
    if (3 < tVar4) {
      return false;
    }
    local_54 = read_impl<unsigned_int,char_const>(&local_30);
    iVar5 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_54);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      ::std::__shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                    *)&local_50,
                   (__shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                    *)((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                             ._M_cur + 0x10));
      bVar2 = udp_tracker_connection::on_receive
                        ((udp_tracker_connection *)local_50._M_dataplus._M_p,ep,buf);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
      return bVar2;
    }
    iVar3 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar3 == '\0') {
      return false;
    }
    psVar1 = this->m_ses;
    print_endpoint_abi_cxx11_(&local_50,(aux *)ep,ep_01);
    (*psVar1->_vptr_session_logger[1])
              (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
               local_50._M_dataplus._M_p,(ulong)local_54);
  }
  ::std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool tracker_manager::incoming_packet(udp::endpoint const& ep
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 8)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming packet from %s, not a UDP tracker message "
					"(%d Bytes)", print_endpoint(ep).c_str(), int(buf.size()));
			}
#endif
			return false;
		}

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming UDP tracker packet from %s has invalid "
					"transaction ID (%x)", print_endpoint(ep).c_str()
					, transaction);
			}
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive(ep, buf);
	}